

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QDateTime *dt,QWidget *parent)

{
  char cVar1;
  DateTimePickerPrivate *this_00;
  QSizePolicy type;
  code *local_50;
  undefined8 uStack_48;
  QTime local_3c;
  undefined1 local_38 [8];
  undefined1 local_30 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  local_20;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a7508;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_001a76b8;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,QDateTime);
  (this->d).d = this_00;
  type.field_0 = SUB84(this,0);
  QWidget::setSizePolicy(type);
  cVar1 = QDateTime::isValid();
  if (cVar1 == '\0') {
    QDate::QDate((QDate *)&local_20,100,1,1);
    QTime::QTime(&local_3c,0,0,0,0);
    QDateTime::QDateTime((QDateTime *)&local_50,(QDate)local_20.d,local_3c,LocalTime,0);
  }
  else {
    QDateTime::QDateTime((QDateTime *)&local_50,dt);
  }
  setDateTime(this,(QDateTime *)&local_50);
  QDateTime::~QDateTime((QDateTime *)&local_50);
  local_50 = _q_scrollAboutToStart;
  uStack_48 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)(local_30 + 8),(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::aboutToStart,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)(local_30 + 8));
  local_50 = _q_scroll;
  uStack_48 = 0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)local_30,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::scroll,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  local_50 = _q_scrollFinished;
  uStack_48 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_38,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::finished,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QDateTime & dt, QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QDateTime ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	setDateTime( dt.isValid() ? dt : DATETIMEPICKER_DATETIME_MIN );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}